

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall
Js::JSONStringifier::SetStringGap(JSONStringifier *this,JavascriptString *spaceString)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  BOOL BVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  char16 *dst;
  char16 *src;
  uint uVar6;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  cVar3 = JavascriptString::GetLength(spaceString);
  uVar6 = 10;
  if (cVar3 < 10) {
    uVar6 = cVar3;
  }
  this->gapLength = uVar6;
  if (cVar3 != 0) {
    data.plusSize = (size_t)uVar6;
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_6a35c48;
    data.filename._0_4_ = 0x1e;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_58);
    uVar6 = this->gapLength;
    if ((ulong)uVar6 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      dst = (char16 *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00b65557;
        *puVar5 = 0;
      }
      dst = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this_00,(ulong)uVar6 * 2);
      if (dst == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) {
LAB_00b65557:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        dst = (char16 *)0x0;
      }
    }
    this->gap = dst;
    uVar6 = this->gapLength;
    src = JavascriptString::GetString(spaceString);
    memcpy_s(dst,(ulong)uVar6 * 2,src,(ulong)this->gapLength * 2);
  }
  return;
}

Assistant:

void
JSONStringifier::SetStringGap(_In_ JavascriptString* spaceString)
{
    this->gapLength = min(MaxGapLength, spaceString->GetLength());
    if (this->gapLength != 0)
    {
        this->gap = RecyclerNewArrayLeaf(this->scriptContext->GetRecycler(), char16, this->gapLength);
        wmemcpy_s(gap, this->gapLength, spaceString->GetString(), this->gapLength);
    }
}